

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O2

int find_paren(char **string)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  byte **ppbVar4;
  byte *local_28;
  
  ppbVar4 = (byte **)string;
LAB_0012d4f3:
  do {
    pcVar2 = (char *)*ppbVar4;
    cVar1 = *pcVar2;
    switch(cVar1) {
    case '\"':
      local_28 = (byte *)(pcVar2 + 1);
      iVar3 = find_doublequote((char **)&local_28);
      break;
    case '#':
    case '$':
    case '%':
    case '&':
switchD_0012d508_caseD_23:
      local_28 = (byte *)(pcVar2 + 1);
      ppbVar4 = &local_28;
      goto LAB_0012d4f3;
    case '\'':
      local_28 = (byte *)(pcVar2 + 1);
      iVar3 = find_quote((char **)&local_28);
      break;
    case '(':
      local_28 = (byte *)(pcVar2 + 1);
      iVar3 = find_paren((char **)&local_28);
      break;
    case ')':
      *string = pcVar2 + 1;
      return 0;
    default:
      if (cVar1 == '[') {
        local_28 = (byte *)(pcVar2 + 1);
        iVar3 = find_bracket((char **)&local_28);
      }
      else {
        if (cVar1 != '{') {
          if (cVar1 == '\0') {
            return 1;
          }
          goto switchD_0012d508_caseD_23;
        }
        local_28 = (byte *)(pcVar2 + 1);
        iVar3 = find_curlybracket((char **)&local_28);
      }
    }
    ppbVar4 = &local_28;
    if (iVar3 != 0) {
      return 1;
    }
  } while( true );
}

Assistant:

static int find_paren(char **string)

/*  
    look for the closing parenthesis character in the input string
*/
{
    char *tstr;

    tstr = *string;

    while (*tstr) {

        if (*tstr == ')') { /* found the closing parens */
           *string = tstr + 1;  /* set pointer to next char */
           return(0); 
        } else if (*tstr == '(') { /* found another level of parens */
           tstr++;
           if (find_paren(&tstr)) return(1); 
        } else if (*tstr == '[') { 
           tstr++;
           if (find_bracket(&tstr)) return(1);
        } else if (*tstr == '{') { 
           tstr++;
           if (find_curlybracket(&tstr)) return(1);
        } else if (*tstr == '"') { 
           tstr++;
           if (find_doublequote(&tstr)) return(1);
        } else if (*tstr == '\'') { 
           tstr++;
           if (find_quote(&tstr)) return(1);
        } else { 
           tstr++;
        }
    }
    return(1);  /* opps, didn't find the closing character */
}